

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O1

void vector_insert_empty(vector v,size_t position)

{
  size_t sVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  void *__src;
  void *__dest;
  ulong uVar6;
  
  if (v != (vector)0x0) {
    if ((v->size == v->capacity) && (iVar3 = vector_reserve(v,v->capacity * 2), iVar3 != 0)) {
      log_write_impl_va("metacall",0x18e,"vector_insert_empty",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,3,"Vector reserve error");
    }
    lVar4 = v->size - position;
    if (position <= v->size && lVar4 != 0) {
      sVar1 = v->type_size;
      pvVar2 = v->data;
      if (pvVar2 == (void *)0x0) {
        __dest = (void *)0x0;
      }
      else {
        uVar5 = sVar1 * position;
        uVar6 = v->capacity * sVar1;
        __dest = (void *)0x0;
        if (uVar5 <= uVar6 && uVar6 - uVar5 != 0) {
          __dest = (void *)((long)pvVar2 + uVar5);
        }
      }
      if (pvVar2 == (void *)0x0) {
        __src = (void *)0x0;
      }
      else {
        uVar6 = (position + 1) * sVar1;
        uVar5 = v->capacity * sVar1;
        __src = (void *)0x0;
        if (uVar6 <= uVar5 && uVar5 - uVar6 != 0) {
          __src = (void *)((long)pvVar2 + uVar6);
        }
      }
      memmove(__dest,__src,sVar1 * lVar4);
    }
    v->size = v->size + 1;
  }
  return;
}

Assistant:

void vector_insert_empty(vector v, size_t position)
{
	if (v != NULL)
	{
		if (v->size == v->capacity)
		{
			if (vector_reserve(v, v->capacity * VECTOR_CAPACITY_INCREMENT) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");
			}
		}

		if (position < v->size)
		{
			memmove(vector_data_offset_bytes(v, position * v->type_size),
				vector_data_offset_bytes(v, (position + 1) * v->type_size),
				(v->size - position) * v->type_size);
		}

		++v->size;
	}
}